

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

Lit __thiscall Minisat::Clause::subsumes(Clause *this,Clause *other)

{
  anon_struct_4_5_613047fb_for_header aVar1;
  anon_struct_4_5_613047fb_for_header aVar2;
  anon_struct_4_5_613047fb_for_header aVar3;
  anon_struct_4_5_613047fb_for_header aVar4;
  Clause CVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  aVar4 = this->header;
  if (((uint)aVar4 & 4) == 0) {
    aVar1 = other->header;
    if (((uint)aVar1 & 4) == 0) {
      if (((uint)aVar4 & 8) == 0) {
        pcVar6 = "header.has_extra";
      }
      else {
        if (((uint)aVar1 & 8) != 0) {
          uVar7 = (uint)aVar1 >> 5;
          uVar8 = (uint)aVar4 >> 5;
          if ((uVar7 < uVar8) ||
             (((uint)this[(ulong)uVar8 + 1].header & ~(uint)other[(ulong)uVar7 + 1].header) != 0)) {
LAB_0011326f:
            aVar3 = (anon_struct_4_5_613047fb_for_header)0xffffffff;
          }
          else {
            aVar3 = (anon_struct_4_5_613047fb_for_header)0xfffffffe;
            if (0x1f < (uint)aVar4) {
              bVar11 = 0x1f < (uint)aVar1;
              uVar9 = 0;
              aVar4 = (anon_struct_4_5_613047fb_for_header)0xfffffffe;
              do {
                aVar3 = aVar4;
                bVar12 = bVar11;
                if (0x1f < (uint)aVar1) {
                  aVar2 = this[uVar9 + 1].header;
                  CVar5.header = other[1].header;
                  if (aVar2 != CVar5.header) {
                    uVar10 = 1;
                    do {
                      if (((aVar4 == (anon_struct_4_5_613047fb_for_header)0xfffffffe) &&
                          (aVar3 = aVar2, ((uint)CVar5.header ^ (uint)aVar2) == 1)) ||
                         (bVar12 = uVar10 < uVar7, aVar3 = aVar4, uVar10 == uVar7)) break;
                      CVar5.header = other[uVar10 + 1].header;
                      uVar10 = uVar10 + 1;
                    } while (aVar2 != CVar5.header);
                  }
                }
                if (!bVar12) goto LAB_0011326f;
                uVar9 = uVar9 + 1;
                aVar4 = aVar3;
              } while (uVar9 != uVar8);
            }
          }
          return (Lit)(int)aVar3;
        }
        pcVar6 = "other.header.has_extra";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/SolverTypes.h"
                    ,0x1bb,"Lit Minisat::Clause::subsumes(const Clause &) const");
    }
    pcVar6 = "!other.header.learnt";
  }
  else {
    pcVar6 = "!header.learnt";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/SolverTypes.h"
                ,0x1ba,"Lit Minisat::Clause::subsumes(const Clause &) const");
}

Assistant:

inline Lit Clause::subsumes(const Clause& other) const
{
    //if (other.size() < size() || (extra.abst & ~other.extra.abst) != 0)
    //if (other.size() < size() || (!learnt() && !other.learnt() && (extra.abst & ~other.extra.abst) != 0))
    assert(!header.learnt);   assert(!other.header.learnt);
    assert(header.has_extra); assert(other.header.has_extra);
    if (other.header.size < header.size || (data[header.size].abs & ~other.data[other.header.size].abs) != 0)
        return lit_Error;

    Lit        ret = lit_Undef;
    const Lit* c   = (const Lit*)(*this);
    const Lit* d   = (const Lit*)other;

    for (unsigned i = 0; i < header.size; i++) {
        // search for c[i] or ~c[i]
        for (unsigned j = 0; j < other.header.size; j++)
            if (c[i] == d[j])
                goto ok;
            else if (ret == lit_Undef && c[i] == ~d[j]){
                ret = c[i];
                goto ok;
            }

        // did not find it
        return lit_Error;
    ok:;
    }

    return ret;
}